

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

unsigned_long xmlSchemaValDecimalGetSignificantDigitCount(xmlSchemaValDecimal *decimal)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = decimal->fractionalPlaces;
  if (uVar1 == 1) {
    uVar2 = decimal->integralPlaces;
    uVar1 = (uint)(decimal->str[(ulong)uVar2 + 2] != '0');
  }
  else {
    uVar2 = decimal->integralPlaces;
  }
  if (uVar2 == 1) {
    uVar2 = (uint)(decimal->str[1] != '0');
  }
  return (ulong)(uVar2 + uVar1 + (uint)(uVar2 + uVar1 == 0));
}

Assistant:

static unsigned long
xmlSchemaValDecimalGetSignificantDigitCount(const xmlSchemaValDecimal *decimal)
{
	unsigned fractionalPlaces = xmlSchemaValDecimalIsInteger(decimal) ? 0 : decimal->fractionalPlaces;
	unsigned integralPlaces = decimal->integralPlaces;
	if(integralPlaces == 1 && decimal->str[1] == '0')
	{
		integralPlaces = 0;
	}
	if(integralPlaces+fractionalPlaces == 0)
	{
		/* 0, but that's still 1 significant digit */
		return 1;
	}
	return integralPlaces+fractionalPlaces;
}